

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_deserialize_list_element
          (t_php_generator *this,ostream *out,t_list *tlist,string *prefix)

{
  t_type *type;
  ostream *poVar1;
  allocator local_171;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  t_field felem;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string elem;
  string *prefix_local;
  t_list *tlist_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  elem.field_2._8_8_ = prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"elem",&local_69);
  t_generator::tmp((string *)local_48,(t_generator *)this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  type = t_list::get_elem_type(tlist);
  std::__cxx11::string::string((string *)&local_150,(string *)local_48);
  t_field::t_field((t_field *)local_130,type,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"$");
  poVar1 = std::operator<<(poVar1,(string *)local_48);
  poVar1 = std::operator<<(poVar1," = null;");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"",&local_171);
  generate_deserialize_field(this,out,(t_field *)local_130,&local_170,false);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"$");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1," []= $");
  poVar1 = std::operator<<(poVar1,(string *)local_48);
  poVar1 = std::operator<<(poVar1,";");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_field::~t_field((t_field *)local_130);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void t_php_generator::generate_deserialize_list_element(ostream& out,
                                                        t_list* tlist,
                                                        string prefix) {
  string elem = tmp("elem");
  t_field felem(tlist->get_elem_type(), elem);

  indent(out) << "$" << elem << " = null;" << endl;

  generate_deserialize_field(out, &felem);

  indent(out) << "$" << prefix << " []= $" << elem << ";" << endl;
}